

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcols.c
# Opt level: O1

int ffpcns(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
          char **array,char *nulvalue,int *status)

{
  int iVar1;
  long lVar2;
  ulong nelem_00;
  char **ppcVar3;
  ulong nelempar;
  long lVar4;
  long lVar5;
  LONGLONG LVar6;
  long width;
  long local_58;
  char **local_50;
  LONGLONG local_48;
  long local_40;
  long local_38;
  
  if (0 < *status) {
    return *status;
  }
  local_50 = array;
  local_48 = nelem;
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar1 = ffrdef(fptr,status), 0 < iVar1))
    goto LAB_001a4d61;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  ffgtcl(fptr,colnum,(int *)0x0,&local_58,&local_38,status);
  if (fptr->Fptr->hdutype == 2) {
    local_58 = local_58 / local_38;
  }
  lVar4 = (firstrow + -1) * local_58 + firstelem;
  if (local_48 < 1) {
    nelem_00 = 0;
    nelempar = 0;
    lVar2 = 0;
    lVar5 = lVar4;
  }
  else {
    nelempar = 0;
    nelem_00 = 0;
    ppcVar3 = local_50;
    LVar6 = local_48;
    local_40 = lVar4;
    do {
      iVar1 = strcmp(nulvalue,*ppcVar3);
      if (iVar1 == 0) {
        if ((nelem_00 != 0) &&
           (lVar2 = (long)(~nelem_00 + lVar4) / local_58,
           iVar1 = ffpcls(fptr,colnum,lVar2 + 1,lVar4 - (local_58 * lVar2 + nelem_00),nelem_00,
                          ppcVar3 + -nelem_00,status), 0 < iVar1)) goto LAB_001a4d61;
        nelempar = nelempar + 1;
        nelem_00 = 0;
      }
      else {
        if ((nelempar != 0) &&
           (lVar2 = (long)(~nelempar + lVar4) / local_58,
           iVar1 = ffpclu(fptr,colnum,lVar2 + 1,lVar4 - (local_58 * lVar2 + nelempar),nelempar,
                          status), 0 < iVar1)) goto LAB_001a4d61;
        nelem_00 = nelem_00 + 1;
        nelempar = 0;
      }
      ppcVar3 = ppcVar3 + 1;
      lVar4 = lVar4 + 1;
      LVar6 = LVar6 + -1;
      lVar2 = local_48;
      lVar5 = local_40;
    } while (LVar6 != 0);
  }
  if (nelem_00 == 0) {
    if (nelempar != 0) {
      lVar4 = (long)((lVar2 - nelempar) + lVar5 + -1) / local_58;
      ffpclu(fptr,colnum,lVar4 + 1,((lVar2 - nelempar) + lVar5) - lVar4 * local_58,nelempar,status);
    }
  }
  else {
    lVar2 = lVar2 - nelem_00;
    lVar4 = (lVar2 + lVar5 + -1) / local_58;
    ffpcls(fptr,colnum,lVar4 + 1,(lVar2 + lVar5) - lVar4 * local_58,nelem_00,local_50 + lVar2,status
          );
  }
LAB_001a4d61:
  return *status;
}

Assistant:

int ffpcns( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - number of column to write (1 = 1st col) */
            LONGLONG  firstrow,  /* I - first row to write (1 = 1st row)        */
            LONGLONG  firstelem, /* I - first vector element to write (1 = 1st) */
            LONGLONG  nelem,     /* I - number of values to write               */
            char  **array,   /* I - array of values to write                */
            char  *nulvalue, /* I - string representing a null value        */
            int  *status)    /* IO - error status                           */
/*
  Write an array of elements to the specified column of a table.  Any input
  pixels flagged as null will be replaced by the appropriate
  null value in the output FITS file. 
*/
{
    long repeat, width;
    LONGLONG ngood = 0, nbad = 0, ii;
    LONGLONG first, fstelm, fstrow;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
    {
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);
    }

    /* get the vector repeat length of the column */
    ffgtcl(fptr, colnum, NULL, &repeat, &width, status);

    if ((fptr->Fptr)->hdutype == BINARY_TBL)
        repeat = repeat / width;    /* convert from chars to unit strings */

    /* absolute element number in the column */
    first = (firstrow - 1) * repeat + firstelem;

    for (ii = 0; ii < nelem; ii++)
    {
      if (strcmp(nulvalue, array[ii]))  /* is this a good pixel? */
      {
         if (nbad)  /* write previous string of bad pixels */
         {
            fstelm = ii - nbad + first;  /* absolute element number */
            fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
            fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

            if (ffpclu(fptr, colnum, fstrow, fstelm, nbad, status) > 0)
                return(*status);
            nbad=0;
         }

         ngood = ngood +1;  /* the consecutive number of good pixels */
      }
      else
      {
         if (ngood)  /* write previous string of good pixels */
         {
            fstelm = ii - ngood + first;  /* absolute element number */
            fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
            fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

            if (ffpcls(fptr, colnum, fstrow, fstelm, ngood, &array[ii-ngood],
                status) > 0)
                return(*status);

            ngood=0;
         }

         nbad = nbad +1;  /* the consecutive number of bad pixels */
      }
    }

    /* finished loop;  now just write the last set of pixels */

    if (ngood)  /* write last string of good pixels */
    {
      fstelm = ii - ngood + first;  /* absolute element number */
      fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
      fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

      ffpcls(fptr, colnum, fstrow, fstelm, ngood, &array[ii-ngood], status);
    }
    else if (nbad) /* write last string of bad pixels */
    {
      fstelm = ii - nbad + first;  /* absolute element number */
      fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
      fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

      ffpclu(fptr, colnum, fstrow, fstelm, nbad, status);
    }

    return(*status);
}